

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O3

void __thiscall CppJieba::MPSegment::~MPSegment(MPSegment *this)

{
  pointer pcVar1;
  
  (this->super_SegmentBase).super_ISegment._vptr_ISegment = (_func_int **)&PTR__MPSegment_0011bcb8;
  if ((this->super_SegmentBase)._isInited == true) {
    Trie::dispose(&this->_trie);
    (this->super_SegmentBase)._isInited = false;
  }
  pcVar1 = (this->_dictPath)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_dictPath).field_2) {
    operator_delete(pcVar1);
  }
  Trie::~Trie(&this->_trie);
  return;
}

Assistant:

MPSegment(const char * const dictPath): _dictPath(dictPath){}